

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckSemicolonSpace.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckSemicolonSpace(Parser *this,unsigned_long max)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  Parser *pPVar4;
  Parser *__x;
  ulong in_RSI;
  string *in_RDI;
  Error error_1;
  unsigned_long i_1;
  char *localval;
  size_t length_1;
  Error error;
  unsigned_long space;
  long i;
  long posSemicolon;
  bool hasError;
  char *val;
  size_t length;
  value_type *in_stack_fffffffffffffe18;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  Parser *in_stack_fffffffffffffe28;
  allocator *in_stack_fffffffffffffe30;
  undefined6 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3e;
  byte bVar5;
  byte bVar6;
  undefined1 in_stack_fffffffffffffe3f;
  Parser *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  allocator *replacingString;
  size_t in_stack_fffffffffffffe50;
  Parser *size;
  string *in_stack_fffffffffffffe58;
  Parser *in_stack_fffffffffffffe60;
  Parser *in_stack_fffffffffffffe68;
  Parser *in_stack_fffffffffffffe70;
  Parser *in_stack_fffffffffffffe78;
  char *pcVar7;
  Parser *in_stack_fffffffffffffeb0;
  Parser *in_stack_fffffffffffffeb8;
  string local_138 [37];
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  Parser *local_c8;
  Parser *local_c0;
  undefined8 local_b8;
  long local_b0;
  long local_a8;
  undefined8 local_a0;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  ulong local_40;
  long local_38;
  Parser *local_30;
  byte local_21;
  char *local_20;
  undefined8 local_18;
  ulong local_10;
  
  in_RDI[1].field_2._M_local_buf[7] = '\x01';
  local_18 = 0xff;
  local_10 = in_RSI;
  local_20 = (char *)operator_new__(0xff);
  snprintf(local_20,0xff,"Semicolons = %ld max spaces",local_10);
  std::__cxx11::string::operator=((string *)(in_RDI[9].field_2._M_local_buf + 8),local_20);
  pcVar7 = local_20;
  if (local_20 != (char *)0x0) {
    operator_delete__(local_20);
  }
  local_21 = 0;
  local_30 = (Parser *)std::__cxx11::string::find(in_RDI[0x28].field_2._M_local_buf + 8,0x1e54be);
  do {
    if (local_30 == (Parser *)0xffffffffffffffff) {
      local_30 = (Parser *)
                 std::__cxx11::string::find(in_RDI[0x28].field_2._M_local_buf + 8,0x1e54be);
      do {
        local_c8 = local_30;
        if (local_30 == (Parser *)0xffffffffffffffff) {
          return (bool)((local_21 ^ 0xff) & 1);
        }
        while( true ) {
          local_c8 = (Parser *)
                     ((long)&(local_c8->m_ErrorList).
                             super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
          size = local_c8;
          pPVar4 = (Parser *)std::__cxx11::string::size();
          if (pPVar4 <= size) break;
          pcVar3 = (char *)std::__cxx11::string::operator[]
                                     ((ulong)((long)&in_RDI[0x28].field_2 + 8));
          if (((*pcVar3 != ' ') &&
              (pcVar3 = (char *)std::__cxx11::string::operator[]
                                          ((ulong)((long)&in_RDI[0x28].field_2 + 8)),
              *pcVar3 != '\r')) &&
             (pcVar3 = (char *)std::__cxx11::string::operator[]
                                         ((ulong)((long)&in_RDI[0x28].field_2 + 8)), *pcVar3 != '\n'
             )) {
            pcVar3 = (char *)std::__cxx11::string::operator[]
                                       ((ulong)((long)&in_RDI[0x28].field_2 + 8));
            if (*pcVar3 != ';') break;
            replacingString = &local_e9;
            pPVar4 = local_c8;
            std::allocator<char>::allocator();
            local_112 = 0;
            local_113 = 0;
            std::__cxx11::string::string(local_e8,"",replacingString);
            uVar2 = IsBetweenCharsFast(in_stack_fffffffffffffe78,
                                       (char)((ulong)in_stack_fffffffffffffe70 >> 0x38),
                                       (char)((ulong)in_stack_fffffffffffffe70 >> 0x30),
                                       (size_t)in_stack_fffffffffffffe68,
                                       SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0),
                                       in_stack_fffffffffffffe58);
            bVar5 = 0;
            if (!(bool)uVar2) {
              in_stack_fffffffffffffe30 = &local_111;
              in_stack_fffffffffffffe28 = local_c8;
              std::allocator<char>::allocator();
              local_112 = 1;
              std::__cxx11::string::string(local_110,"",in_stack_fffffffffffffe30);
              local_113 = 1;
              in_stack_fffffffffffffe27 =
                   IsBetweenQuote(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0,
                                  SUB81((ulong)pcVar7 >> 0x38,0),in_RDI);
              bVar5 = in_stack_fffffffffffffe27 ^ 0xff;
            }
            bVar6 = bVar5;
            if ((local_113 & 1) != 0) {
              std::__cxx11::string::~string(local_110);
            }
            if ((local_112 & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&local_111);
            }
            std::__cxx11::string::~string(local_e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_e9);
            if ((bVar5 & 1) != 0) {
              ErrorStruct::ErrorStruct((ErrorStruct *)0x1a18c6);
              __x = (Parser *)
                    GetLineNumber((Parser *)
                                  CONCAT17(uVar2,CONCAT16(bVar6,in_stack_fffffffffffffe38)),
                                  (size_t)in_stack_fffffffffffffe30,
                                  SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
              in_stack_fffffffffffffeb0 = __x;
              in_stack_fffffffffffffeb8 = __x;
              std::__cxx11::string::operator=(local_138,"Too many semicolons");
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                         CONCAT17(in_stack_fffffffffffffe27,
                                  CONCAT16(bVar5,in_stack_fffffffffffffe20)),(value_type *)__x);
              local_21 = 1;
              if ((in_RDI[0x31]._M_string_length & 1) != 0) {
                GetPositionWithComments
                          (pPVar4,CONCAT17(uVar2,CONCAT16(bVar6,in_stack_fffffffffffffe38)));
                ReplaceCharInFixedBuffer
                          (in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58,(size_t)size,
                           (char *)replacingString);
              }
              ErrorStruct::~ErrorStruct((ErrorStruct *)0x1a1a79);
            }
          }
        }
        local_30 = (Parser *)
                   std::__cxx11::string::find(in_RDI[0x28].field_2._M_local_buf + 8,0x1e54be);
      } while( true );
    }
    local_40 = 0;
    local_38 = (long)local_30;
    while (local_38 = local_38 + -1, -1 < local_38) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)((long)&in_RDI[0x28].field_2 + 8));
      if (*pcVar3 != ' ') {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)((long)&in_RDI[0x28].field_2 + 8));
        if ((*pcVar3 != '\n') && (local_10 < local_40)) {
          ErrorStruct::ErrorStruct((ErrorStruct *)0x1a13c5);
          local_b0 = GetLineNumber((Parser *)
                                   CONCAT17(in_stack_fffffffffffffe3f,
                                            CONCAT16(in_stack_fffffffffffffe3e,
                                                     in_stack_fffffffffffffe38)),
                                   (size_t)in_stack_fffffffffffffe30,
                                   SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
          local_a0 = 7;
          local_a8 = local_b0;
          std::__cxx11::string::operator=(local_98,"Number of spaces before semicolon exceed: ");
          local_b8 = 10;
          in_stack_fffffffffffffe78 = (Parser *)operator_new__(10);
          local_c0 = in_stack_fffffffffffffe78;
          snprintf((char *)in_stack_fffffffffffffe78,10,"%ld",local_40);
          std::__cxx11::string::operator+=(local_98,(char *)local_c0);
          std::__cxx11::string::operator+=(local_98," (max=");
          in_stack_fffffffffffffe70 = local_c0;
          if (local_c0 != (Parser *)0x0) {
            operator_delete__(local_c0);
          }
          in_stack_fffffffffffffe68 = (Parser *)operator_new__(10);
          local_c0 = in_stack_fffffffffffffe68;
          snprintf((char *)in_stack_fffffffffffffe68,10,"%ld",local_10);
          std::__cxx11::string::operator+=(local_98,(char *)local_c0);
          std::__cxx11::string::operator+=(local_98,")");
          in_stack_fffffffffffffe60 = local_c0;
          if (local_c0 != (Parser *)0x0) {
            operator_delete__(local_c0);
          }
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                     CONCAT17(in_stack_fffffffffffffe27,
                              CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                     in_stack_fffffffffffffe18);
          local_21 = 1;
          if ((in_RDI[0x31]._M_string_length & 1) != 0) {
            in_stack_fffffffffffffe58 =
                 (string *)
                 GetPositionWithComments
                           (in_stack_fffffffffffffe40,
                            CONCAT17(in_stack_fffffffffffffe3f,
                                     CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)))
            ;
            ReplaceCharInFixedBuffer
                      (in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58,
                       in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          }
          ErrorStruct::~ErrorStruct((ErrorStruct *)0x1a15f6);
        }
        break;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"",&local_61);
      bVar1 = IsBetweenQuote(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0,
                             SUB81((ulong)pcVar7 >> 0x38,0),in_RDI);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_40 = local_40 + 1;
      }
    }
    local_30 = (Parser *)std::__cxx11::string::find(in_RDI[0x28].field_2._M_local_buf + 8,0x1e54be);
  } while( true );
}

Assistant:

bool Parser::CheckSemicolonSpace(unsigned long max)
{
  m_TestsDone[SEMICOLON_SPACE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Semicolons = %ld max spaces",max);
  m_TestsDescription[SEMICOLON_SPACE] = val;
  delete [] val;

  bool hasError = false;
  auto posSemicolon = static_cast<long int>(m_BufferNoComment.find(";", 0));
  while(posSemicolon != -1)
    {
    // We try to find the word before that
    long i=posSemicolon-1;
    unsigned long space = 0;
    while(i>=0)
      {
       if(m_BufferNoComment[i] == ' ')
        {
        if(!IsBetweenQuote(i))
          {
          space++;
          }
        }
       else
        {
        if(m_BufferNoComment[i] != '\n' && space > max)
          {
          Error error;
          error.line = this->GetLineNumber(posSemicolon,true);
          error.line2 = error.line;
          error.number = SEMICOLON_SPACE;
          error.description = "Number of spaces before semicolon exceed: ";
          constexpr size_t length = 10;
          char* localval = new char[length];
          snprintf(localval,length,"%ld",space);
          error.description += localval;
          error.description += " (max=";
          delete [] localval;
          localval = new char[length];
          snprintf(localval,length,"%ld",max);
          error.description += localval;
          error.description += ")";
          delete [] localval;
          m_ErrorList.push_back(error);
          hasError = true;

          if(m_FixFile)
            {
            this->ReplaceCharInFixedBuffer(this->GetPositionWithComments(posSemicolon-space),space,"");
            }
          } // space > max
        break;
        }
      i--;
      }
    posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",posSemicolon+1));
    }

  // We also check if we have two or more semicolons following each other
  posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",0));
  while(posSemicolon != -1)
    {
    // We look forward
    unsigned long i=posSemicolon+1;
    while(i<m_BufferNoComment.size())
      {
      if(m_BufferNoComment[i] == ' ' || m_BufferNoComment[i] == '\r' || m_BufferNoComment[i] == '\n')
        {
        // this is normal
        }
      else if(m_BufferNoComment[i] == ';')
        {
        // if we have for ( ;; ) we don't report
        // or ";;"
        if(!this->IsBetweenCharsFast('(',')',i)
           && !this->IsBetweenQuote(i))
          {
          Error error;
          error.line = this->GetLineNumber(i,true);
          error.line2 = error.line;
          error.number = SEMICOLON_SPACE;
          error.description = "Too many semicolons";
          m_ErrorList.push_back(error);
          hasError = true;

          if(m_FixFile)
            {
            this->ReplaceCharInFixedBuffer(this->GetPositionWithComments(i),1,"");
            }
          }
        }
      else
        {
        break;
        }
      i++;
      }
    posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",i+1));
    }

  return !hasError;
}